

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O0

Clifford * inverse(Clifford *__return_storage_ptr__,Clifford *A)

{
  pointer *this;
  bool bVar1;
  vector<Blade,_std::allocator<Blade>_> local_140;
  vector<Blade,_std::allocator<Blade>_> local_128;
  vector<Blade,_std::allocator<Blade>_> local_110;
  undefined1 local_f8 [8];
  Clifford inv;
  vector<Blade,_std::allocator<Blade>_> local_c8;
  undefined1 local_b0 [8];
  Clifford temp;
  undefined1 local_80 [8];
  Clifford xb;
  vector<Blade,_std::allocator<Blade>_> local_50;
  vector<Blade,_std::allocator<Blade>_> local_38;
  float local_1c;
  Clifford *pCStack_18;
  float sk;
  Clifford *A_local;
  Clifford *result;
  
  pCStack_18 = A;
  A_local = __return_storage_ptr__;
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_38,A);
  operator<=(&local_1c,&local_38);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_38);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_50,A);
  bVar1 = isScalar(&local_50);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_50);
  if (bVar1) {
    std::vector<Blade,_std::allocator<Blade>_>::vector(__return_storage_ptr__);
    Blade::Blade((Blade *)&xb.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,0,1.0 / local_1c);
    std::vector<Blade,_std::allocator<Blade>_>::push_back
              (__return_storage_ptr__,
               (value_type *)
               &xb.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    Blade::~Blade((Blade *)&xb.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage);
  }
  else {
    this = &temp.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage;
    std::vector<Blade,_std::allocator<Blade>_>::vector
              ((vector<Blade,_std::allocator<Blade>_> *)this,A);
    operator!((Clifford *)local_80,(Clifford *)this);
    std::vector<Blade,_std::allocator<Blade>_>::~vector
              ((vector<Blade,_std::allocator<Blade>_> *)
               &temp.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<Blade,_std::allocator<Blade>_>::vector(&local_c8,A);
    std::vector<Blade,_std::allocator<Blade>_>::vector
              ((vector<Blade,_std::allocator<Blade>_> *)
               &inv.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<Blade,_std::allocator<Blade>_> *)local_80);
    operator|((Clifford *)local_b0,&local_c8,
              (Clifford *)
              &inv.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data
               ._M_end_of_storage);
    std::vector<Blade,_std::allocator<Blade>_>::~vector
              ((vector<Blade,_std::allocator<Blade>_> *)
               &inv.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_c8);
    std::vector<Blade,_std::allocator<Blade>_>::vector
              (&local_110,(vector<Blade,_std::allocator<Blade>_> *)local_b0);
    inverse((Clifford *)local_f8,&local_110);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_110);
    std::vector<Blade,_std::allocator<Blade>_>::vector
              (&local_128,(vector<Blade,_std::allocator<Blade>_> *)local_80);
    std::vector<Blade,_std::allocator<Blade>_>::vector
              (&local_140,(vector<Blade,_std::allocator<Blade>_> *)local_f8);
    operator*(__return_storage_ptr__,&local_128,&local_140);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_140);
    std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_128);
    std::vector<Blade,_std::allocator<Blade>_>::~vector
              ((vector<Blade,_std::allocator<Blade>_> *)local_f8);
    std::vector<Blade,_std::allocator<Blade>_>::~vector
              ((vector<Blade,_std::allocator<Blade>_> *)local_b0);
    std::vector<Blade,_std::allocator<Blade>_>::~vector
              ((vector<Blade,_std::allocator<Blade>_> *)local_80);
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford inverse(Clifford A)
{
	float sk; sk<=A;

	if(isScalar(A))
	{
		Clifford result;
		result.push_back(Blade(0, 1.0 / sk));
		return result;
	}

	Clifford xb = !A;
	Clifford temp = A|xb;
	Clifford inv = inverse(temp);
	return (xb*inv);
}